

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O3

void __thiscall hnsw::HNSWIndex::Insert(HNSWIndex *this,index_t q)

{
  PointSet *candidates_00;
  layer_t *plVar1;
  pointer pVVar2;
  pointer ppfVar3;
  long lVar4;
  pointer ppVar5;
  bool bVar6;
  pointer ppVar7;
  layer_t lVar8;
  int iVar9;
  uint M;
  layer_t *plVar10;
  Vertex *pVVar11;
  int layer;
  Point *p;
  pointer ppVar12;
  pointer this_00;
  uint32_t ef;
  uint32_t layer_00;
  pointer this_01;
  float *q_00;
  uint32_t uVar13;
  long lVar14;
  Point ep;
  PointSet selected_points;
  MaxHeap candidates;
  Point local_b8;
  Vertex *local_b0;
  undefined1 local_a8 [16];
  pointer local_98;
  layer_t *local_90;
  layer_t *local_88;
  float *local_80;
  long local_78;
  ulong local_70;
  PointSet local_68;
  MaxHeap local_50;
  
  pVVar2 = (this->vertices_).
           super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pVVar2[q].layer != 0) ||
     (pVVar11 = pVVar2 + q,
     (pVVar11->neighbors).
     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish !=
     (pVVar11->neighbors).
     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)) {
    __assert_fail("vertex.layer == 0 && vertex.neighbors.size() == 0 && \"Vertex has already been inserted\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KinglittleQ[P]hnsw/include/hnsw.hpp"
                  ,0x5a,"void hnsw::HNSWIndex::Insert(index_t)");
  }
  lVar8 = RandomChoiceLayer(this);
  pVVar11->layer = lVar8;
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::resize(&pVVar11->neighbors,(long)(lVar8 + 1));
  this_00 = (pVVar11->neighbors).
            super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this_01 = this_00 + 1;
  local_b0 = pVVar11;
  if (this_01 !=
      (pVVar11->neighbors).
      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      ::reserve(this_01,(ulong)this->maxM_);
      this_01 = this_01 + 1;
    } while (this_01 !=
             (pVVar11->neighbors).
             super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    this_00 = (pVVar11->neighbors).
              super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  plVar1 = &pVVar2[q].layer;
  std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
  reserve(this_00,(ulong)this->maxM0_);
  uVar13 = this->num_points_;
  this->num_points_ = uVar13 + 1;
  if (uVar13 == 0) {
    iVar9 = *plVar1;
  }
  else {
    ppfVar3 = (this->points_).row_ptrs_.
              super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    q_00 = ppfVar3[q];
    (**this->distance_->_vptr_Distance)(this->distance_,q_00,ppfVar3[this->ep_]);
    local_b8.first = this->ep_;
    local_90 = &this->top_layer_;
    layer = this->top_layer_;
    iVar9 = *plVar1;
    if (iVar9 < layer) {
      do {
        SearchUpperLayer(this,q_00,&local_b8,layer);
        iVar9 = *plVar1;
        layer = layer + -1;
      } while (iVar9 < layer);
      layer = *local_90;
    }
    plVar10 = plVar1;
    if (layer < iVar9) {
      plVar10 = local_90;
    }
    lVar14 = (long)*plVar10;
    pVVar11 = local_b0;
    local_88 = plVar1;
    local_80 = q_00;
    if (-1 < lVar14) {
      do {
        local_78 = lVar14 + -1;
        uVar13 = (uint32_t)lVar14;
        if (lVar14 == 0) {
          M = this->maxM0_;
          ef = this->ef_construction_;
          layer_00 = 0;
        }
        else {
          M = this->maxM_;
          ef = this->ef_construction_;
          layer_00 = uVar13;
        }
        SearchLayer(&local_50,this,q_00,&local_b8,ef,layer_00);
        SelectNeighborsHeuristic(&local_68,this,q_00,(PointSet *)&local_50,this->M_);
        ppVar7 = local_68.
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_68.
            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_68.
            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_70 = (ulong)M;
          ppVar12 = local_68.
                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            Vertex::ConnectTo((this->vertices_).
                              super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
                              ._M_impl.super__Vector_impl_data._M_start + ppVar12->first,q,
                              ppVar12->second,uVar13);
            Vertex::ConnectTo(pVVar11,ppVar12->first,ppVar12->second,uVar13);
            lVar4 = *(long *)&(this->vertices_).
                              super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
                              ._M_impl.super__Vector_impl_data._M_start[ppVar12->first].neighbors.
                              super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                              ._M_impl;
            if (local_70 <
                (ulong)(*(long *)(lVar4 + 8 + lVar14 * 0x18) - *(long *)(lVar4 + lVar14 * 0x18) >> 3
                       )) {
              candidates_00 = (PointSet *)(lVar4 + lVar14 * 0x18);
              SelectNeighborsHeuristic
                        ((PointSet *)local_a8,this,
                         (this->points_).row_ptrs_.
                         super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                         super__Vector_impl_data._M_start[ppVar12->first],candidates_00,M);
              ppVar5 = (candidates_00->
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              (candidates_00->
              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              )._M_impl.super__Vector_impl_data._M_start = (pointer)local_a8._0_8_;
              (candidates_00->
              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_a8._8_8_;
              local_a8 = ZEXT816(0) << 0x20;
              (candidates_00->
              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage = local_98;
              local_98 = (pointer)0x0;
              pVVar11 = local_b0;
              if (ppVar5 != (pointer)0x0) {
                operator_delete(ppVar5);
                pVVar11 = local_b0;
                if ((pointer)local_a8._0_8_ != (pointer)0x0) {
                  operator_delete((void *)local_a8._0_8_);
                  pVVar11 = local_b0;
                }
              }
            }
            ppVar12 = ppVar12 + 1;
          } while (ppVar12 != ppVar7);
        }
        if (local_68.
            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        q_00 = local_80;
        if (local_50.super_MaxHeapImpl.c.
            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.super_MaxHeapImpl.c.
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        bVar6 = 0 < lVar14;
        lVar14 = local_78;
      } while (bVar6);
      iVar9 = *local_88;
      layer = *local_90;
    }
    if (iVar9 <= layer) {
      return;
    }
  }
  this->top_layer_ = iVar9;
  this->ep_ = q;
  return;
}

Assistant:

void Insert(index_t q) {
    Vertex &vertex = vertices_[q];
    assert(vertex.layer == 0 && vertex.neighbors.size() == 0 && "Vertex has already been inserted");
    vertex.layer = RandomChoiceLayer();
    vertex.neighbors.resize(vertex.layer + 1);
    for (auto iter = vertex.neighbors.begin() + 1; iter != vertex.neighbors.end(); iter++) {
      iter->reserve(maxM_);
    }
    vertex.neighbors[0].reserve(maxM0_);

    num_points_ += 1;

    if (num_points_ == 1) {
      top_layer_ = vertex.layer;
      ep_ = q;
      return;
    }

    const float *query = points_[q];
    Point ep(ep_, distance_(query, points_[ep_]));
    for (layer_t l = top_layer_; l > vertex.layer; l--) {
      SearchUpperLayer(query, ep, l);
    }

    // Search neighbors and connect to them
    for (layer_t l = std::min(vertex.layer, top_layer_); l >= 0; l--) {
      uint32_t maxM = (l == 0) ? maxM0_ : maxM_;
      MaxHeap candidates = SearchLayer(query, ep, ef_construction_, l);
      PointSet selected_points =
          SelectNeighborsHeuristic(query, candidates.Container(), M_);  // next ep

      for (const Point &p : selected_points) {
        vertices_[p.first].ConnectTo(q, p.second, l);
        vertex.ConnectTo(p.first, p.second, l);

        // Shrink neighbors
        auto &edges = vertices_[p.first].neighbors[l];
        if (edges.size() > maxM) {
          edges = SelectNeighborsHeuristic(points_[p.first], edges, maxM);
        }
      }
    }

    if (vertex.layer > top_layer_) {
      top_layer_ = vertex.layer;
      ep_ = q;
    }

    return;
  }